

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O0

uchar ot::commissioner::utils::Decode<unsigned_char>(uint8_t *aBuf,size_t aLength)

{
  bool bVar1;
  size_t i;
  bool condition;
  uchar ret;
  size_t aLength_local;
  uint8_t *aBuf_local;
  
  i._7_1_ = '\0';
  if (aLength != 0) {
    bVar1 = false;
    while (!bVar1) {
      i._7_1_ = *aBuf;
      bVar1 = true;
    }
    return i._7_1_;
  }
  __assert_fail("condition",
                "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/common/utils.hpp"
                ,0xa2,
                "T ot::commissioner::utils::Decode(const uint8_t *, size_t) [T = unsigned char]");
}

Assistant:

T Decode(const uint8_t *aBuf, size_t aLength)
{
    T ret = 0;

    ASSERT(aLength >= sizeof(T));

    for (size_t i = 0; i < sizeof(T); ++i)
    {
        ret = (ret << 8) | aBuf[i];
    }
    return ret;
}